

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O3

void __thiscall avro::NodeArray::printJson(NodeArray *this,ostream *os,int depth)

{
  indent x;
  element_type *peVar1;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{\n",2);
  x.d = depth + 1;
  operator<<(os,x);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"type\": \"array\",\n",0x11);
  operator<<(os,x);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"items\": ",9);
  peVar1 = (this->super_NodeImplArray).leafAttributes_.attr_.px;
  (*peVar1->_vptr_Node[0xd])(peVar1,os,(ulong)(uint)x.d);
  uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 6),1);
  operator<<(os,(indent)depth);
  uStack_28 = CONCAT17(0x7d,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 7),1);
  return;
}

Assistant:

void 
NodeArray::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(depth+1) << "\"type\": \"array\",\n";
    os << indent(depth+1) <<  "\"items\": ";
    leafAttributes_.get()->printJson(os, depth+1);
    os << '\n';
    os << indent(depth) << '}';
}